

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O2

bool dxil_spv::emit_cbuffer_load_legacy_instruction(Impl *impl,CallInst *instruction)

{
  Op op;
  bool bVar1;
  TypeID TVar2;
  Id IVar3;
  Builder *this;
  Value *pVVar4;
  mapped_type *pmVar5;
  Type *pTVar6;
  LoggingCallback p_Var7;
  void *pvVar8;
  mapped_type *pmVar9;
  Operation *pOVar10;
  Operation *this_00;
  Id ptr_id;
  RawVecSize local_1078;
  uint local_1074;
  int local_1070;
  Id local_106c;
  uint local_1068;
  Op value_cast_op;
  Type *local_1060;
  mapped_type *local_1058;
  Type *local_1050;
  Id physical_type_id;
  Id local_1044;
  Id local_1040;
  Id local_103c;
  char buffer [4096];
  
  this = Converter::Impl::builder(impl);
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  bVar1 = false;
  ptr_id = Converter::Impl::get_id_for_value(impl,pVVar4,0);
  if (ptr_id != 0) {
    if (ptr_id == impl->root_constant_id) {
      bVar1 = emit_cbuffer_load_root_constant(impl,instruction);
      return bVar1;
    }
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&impl->handle_to_resource_meta,&ptr_id);
    pTVar6 = LLVMBC::Value::getType((Value *)instruction);
    TVar2 = LLVMBC::Type::getTypeID(pTVar6);
    if (TVar2 == StructTyID) {
      emit_buffer_synchronization_validation(impl,instruction,Load);
      if (pmVar5->storage == StorageClassShaderRecordBufferKHR) {
        buffer._0_8_ = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
        pmVar9 = std::__detail::
                 _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&impl->handle_to_root_member_offset,(key_type *)buffer);
        bVar1 = emit_cbuffer_load_shader_record(impl,instruction,*pmVar9);
      }
      else {
        if (pmVar5->storage == StorageClassPhysicalStorageBuffer) {
          emit_cbuffer_load_physical_pointer(impl,instruction);
        }
        else {
          local_1050 = pTVar6;
          pTVar6 = LLVMBC::Type::getStructElementType(pTVar6,0);
          value_cast_op = OpNop;
          physical_type_id = 0;
          local_1058 = pmVar5;
          get_physical_load_store_cast_info(impl,pTVar6,&physical_type_id,&value_cast_op);
          local_1068 = get_type_scalar_alignment(impl,pTVar6);
          bVar1 = local_1068 != 8;
          local_1078 = (uint)bVar1 * 2 + V2;
          local_1074 = raw_width_to_bits(bVar1 ^ B64);
          pmVar5 = local_1058;
          local_1070 = (uint)bVar1 * 2 + 2;
          local_1060 = pTVar6;
          TVar2 = LLVMBC::Type::getTypeID(pTVar6);
          ptr_id = get_buffer_alias_handle
                             (impl,pmVar5,ptr_id,(uint)(bVar1 || TVar2 != IntegerTyID),bVar1 ^ B64,
                              local_1078);
          pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
          local_106c = Converter::Impl::get_id_for_value(impl,pVVar4,0);
          if (bVar1 || TVar2 != IntegerTyID) {
            IVar3 = spv::Builder::makeFloatType(this,local_1074);
          }
          else {
            IVar3 = spv::Builder::makeUintType(this,local_1074);
          }
          local_1078 = spv::Builder::makeVectorType(this,IVar3,local_1070);
          IVar3 = spv::Builder::makePointer(this,pmVar5->storage,local_1078);
          pOVar10 = Converter::Impl::allocate(impl,OpAccessChain,IVar3);
          local_1044 = ptr_id;
          local_1040 = spv::Builder::makeUintConstant(this,0,false);
          local_103c = local_106c;
          buffer[8] = '\x03';
          buffer[9] = '\0';
          buffer[10] = '\0';
          buffer[0xb] = '\0';
          buffer[0xc] = '\0';
          buffer[0xd] = '\0';
          buffer[0xe] = '\0';
          buffer[0xf] = '\0';
          buffer._0_8_ = &local_1044;
          Operation::add_ids(pOVar10,(initializer_list<unsigned_int> *)buffer);
          Converter::Impl::add(impl,pOVar10,false);
          if (pmVar5->non_uniform == true) {
            spv::Builder::addDecoration(this,pOVar10->id,DecorationNonUniform,-1);
          }
          pTVar6 = LLVMBC::Type::getStructElementType(local_1050,0);
          TVar2 = LLVMBC::Type::getTypeID(pTVar6);
          this_00 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction,local_1078);
          Operation::add_id(this_00,pOVar10->id);
          Converter::Impl::add(impl,this_00,false);
          if (local_1068 == 2) {
            build_bitcast_32x4_to_16x8_composite(impl,instruction,this_00->id);
          }
          else if ((local_1068 < 8) && (TVar2 == IntegerTyID)) {
            IVar3 = spv::Builder::makeUintType(this,local_1074);
            IVar3 = spv::Builder::makeVectorType(this,IVar3,local_1070);
            pOVar10 = Converter::Impl::allocate(impl,OpBitcast,IVar3);
            Operation::add_id(pOVar10,this_00->id);
            Converter::Impl::add(impl,pOVar10,false);
            Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar10->id);
          }
          op = value_cast_op;
          if (value_cast_op != OpNop) {
            IVar3 = Converter::Impl::get_type_id(impl,local_1060,0);
            IVar3 = spv::Builder::makeVectorType(this,IVar3,local_1070);
            pOVar10 = Converter::Impl::allocate(impl,op,IVar3);
            IVar3 = Converter::Impl::get_id_for_value(impl,(Value *)instruction,0);
            Operation::add_id(pOVar10,IVar3);
            Converter::Impl::add(impl,pOVar10,false);
            Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar10->id);
          }
          build_exploded_composite_from_vector(impl,&instruction->super_Instruction,4);
        }
        bVar1 = true;
      }
    }
    else {
      p_Var7 = get_thread_log_callback();
      if (p_Var7 == (LoggingCallback)0x0) {
        fwrite("[ERROR]: CBufferLoadLegacy: return type must be struct.\n",0x38,1,_stderr);
        fflush(_stderr);
      }
      else {
        builtin_strncpy(buffer + 0x20,"ust be struct.\n",0x10);
        builtin_strncpy(buffer + 0x10,"y: return type m",0x10);
        builtin_strncpy(buffer,"CBufferLoadLegac",0x10);
        pvVar8 = get_thread_log_callback_userdata();
        (*p_Var7)(pvVar8,Error,buffer);
      }
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool emit_cbuffer_load_legacy_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();

	// This function returns a struct, but ignore that, and just return a vec4 for now.
	// extractvalue is used to pull out components and that works for vectors as well.
	spv::Id ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	if (!ptr_id)
		return false;

	if (ptr_id == impl.root_constant_id)
	{
		return emit_cbuffer_load_root_constant(impl, instruction);
	}
	else
	{
		auto &meta = impl.handle_to_resource_meta[ptr_id];

		auto *result_type = instruction->getType();

		if (result_type->getTypeID() != llvm::Type::TypeID::StructTyID)
		{
			LOGE("CBufferLoadLegacy: return type must be struct.\n");
			return false;
		}

		emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

		if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
		{
			return emit_cbuffer_load_physical_pointer(impl, instruction);
		}
		else if (meta.storage == spv::StorageClassShaderRecordBufferKHR)
		{
			return emit_cbuffer_load_shader_record(impl, instruction,
			                                       impl.handle_to_root_member_offset[instruction->getOperand(1)]);
		}

		// Handle min16float where we want FP16 value, but FP32 physical.
		auto *result_component_type = result_type->getStructElementType(0);
		spv::Op value_cast_op = spv::OpNop;
		spv::Id physical_type_id = 0;
		get_physical_load_store_cast_info(impl, result_component_type, physical_type_id, value_cast_op);

		RawVecSize alias_vecsize;
		RawWidth alias_width;
		unsigned scalar_alignment = get_type_scalar_alignment(impl, result_component_type);
		unsigned bits, vecsize;

		if (scalar_alignment == 8)
		{
			alias_width = RawWidth::B64;
			alias_vecsize = RawVecSize::V2;
		}
		else
		{
			alias_width = RawWidth::B32;
			alias_vecsize = RawVecSize::V4;
		}

		bits = raw_width_to_bits(alias_width);
		vecsize = raw_vecsize_to_vecsize(alias_vecsize);

		RawType raw_type = result_component_type->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		                   scalar_alignment == 8 ? RawType::Integer : RawType::Float;

		ptr_id = get_buffer_alias_handle(impl, meta, ptr_id, raw_type, alias_width, alias_vecsize);

		spv::Id vec4_index = impl.get_id_for_value(instruction->getOperand(2));

		spv::Id element_type_id = raw_type == RawType::Integer ?
		                          builder.makeUintType(bits) : builder.makeFloatType(bits);

		spv::Id vector_type_id = builder.makeVectorType(element_type_id, vecsize);
		Operation *access_chain_op = impl.allocate(spv::OpAccessChain, builder.makePointer(meta.storage, vector_type_id));
		access_chain_op->add_ids({ ptr_id, builder.makeUintConstant(0), vec4_index });
		impl.add(access_chain_op);

		if (meta.non_uniform)
			builder.addDecoration(access_chain_op->id, spv::DecorationNonUniformEXT);

		bool need_bitcast = false;
		if (result_type->getStructElementType(0)->getTypeID() == llvm::Type::TypeID::IntegerTyID && scalar_alignment < 8)
			need_bitcast = true;

		Operation *load_op = impl.allocate(spv::OpLoad, instruction, vector_type_id);
		load_op->add_id(access_chain_op->id);
		impl.add(load_op);

		if (scalar_alignment == 2)
		{
			// Special case, need to bitcast and build a struct with 8 elements instead.
			if (!build_bitcast_32x4_to_16x8_composite(impl, instruction, load_op->id))
				return false;
		}
		else if (need_bitcast)
		{
			spv::Id uint_vector_type_id = builder.makeVectorType(builder.makeUintType(bits), vecsize);
			Operation *op = impl.allocate(spv::OpBitcast, uint_vector_type_id);

			op->add_id(load_op->id);
			impl.add(op);
			impl.rewrite_value(instruction, op->id);
		}

		// If we have min-precision loads, we might have to truncate here.
		if (value_cast_op != spv::OpNop)
		{
			auto *cast_op = impl.allocate(value_cast_op, builder.makeVectorType(impl.get_type_id(result_component_type), vecsize));
			cast_op->add_id(impl.get_id_for_value(instruction));
			impl.add(cast_op);
			impl.rewrite_value(instruction, cast_op->id);
		}

		build_exploded_composite_from_vector(impl, instruction, 4);
	}

	return true;
}